

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

void ZydisSetEffectiveOperandWidth
               (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
               ZydisInstructionDefinition *definition)

{
  byte local_21;
  ZyanU8 index;
  ZydisInstructionDefinition *definition_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd1a,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd1b,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  if (definition == (ZydisInstructionDefinition *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd1c,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  local_21 = (instruction->attributes & 0x80000000000) != 0;
  if ((instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_32) ||
     (instruction->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_32)) {
    local_21 = local_21 + 2;
  }
  else if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
    local_21 = local_21 + '\x04' + ((context->vector_unified).W & 1) * '\x02';
  }
  if (((byte)(*(ulong *)definition >> 0x21) & 7) < 8) {
    if (local_21 < 8) {
      instruction->operand_width =
           ZydisSetEffectiveOperandWidth::operand_size_map
           [(uint)((ulong)*(undefined8 *)definition >> 0x21) & 7][local_21];
      context->eosz_index = instruction->operand_width >> 5;
      if (((byte)(*(ulong *)definition >> 0x21) & 7) == 1) {
        instruction->operand_width = '\b';
      }
      return;
    }
    __assert_fail("index < (sizeof(operand_size_map[definition->operand_size_map]) / sizeof((operand_size_map[definition->operand_size_map])[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd88,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  __assert_fail("definition->operand_size_map < (sizeof(operand_size_map) / sizeof((operand_size_map)[0]))"
                ,"/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                ,0xd87,
                "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
               );
}

Assistant:

static void ZydisSetEffectiveOperandWidth(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZydisInstructionDefinition* definition)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(definition);

    static const ZyanU8 operand_size_map[8][8] =
    {
        // Default for most instructions
        {
            16, // 16 __ W0
            32, // 16 66 W0
            32, // 32 __ W0
            16, // 32 66 W0
            32, // 64 __ W0
            16, // 64 66 W0
            64, // 64 __ W1
            64  // 64 66 W1
        },
        // Operand size is forced to 8-bit (this is done later to preserve the `eosz_index`)
        {
            16, // 16 __ W0
            32, // 16 66 W0
            32, // 32 __ W0
            16, // 32 66 W0
            32, // 64 __ W0
            16, // 64 66 W0
            64, // 64 __ W1
            64  // 64 66 W1
        },
        // Operand size override 0x66 is ignored
        {
            16, // 16 __ W0
            16, // 16 66 W0
            32, // 32 __ W0
            32, // 32 66 W0
            32, // 64 __ W0
            32, // 64 66 W0
            64, // 64 __ W1
            64  // 64 66 W1
        },
        // REX.W promotes to 32-bit instead of 64-bit
        {
            16, // 16 __ W0
            32, // 16 66 W0
            32, // 32 __ W0
            16, // 32 66 W0
            32, // 64 __ W0
            16, // 64 66 W0
            32, // 64 __ W1
            32  // 64 66 W1
        },
        // Operand size defaults to 64-bit in 64-bit mode
        {
            16, // 16 __ W0
            32, // 16 66 W0
            32, // 32 __ W0
            16, // 32 66 W0
            64, // 64 __ W0
            16, // 64 66 W0
            64, // 64 __ W1
            64  // 64 66 W1
        },
        // Operand size is forced to 64-bit in 64-bit mode
        {
            16, // 16 __ W0
            32, // 16 66 W0
            32, // 32 __ W0
            16, // 32 66 W0
            64, // 64 __ W0
            64, // 64 66 W0
            64, // 64 __ W1
            64  // 64 66 W1
        },
        // Operand size is forced to 32-bit, if no REX.W is present.
        {
            32, // 16 __ W0
            32, // 16 66 W0
            32, // 32 __ W0
            32, // 32 66 W0
            32, // 64 __ W0
            32, // 64 66 W0
            64, // 64 __ W1
            64  // 64 66 W1
        },
        // Operand size is forced to 64-bit in 64-bit mode and forced to 32-bit in all other modes.
        // This is used for e.g. `mov CR, GPR` and `mov GPR, CR`.
        {
            32, // 16 __ W0
            32, // 16 66 W0
            32, // 32 __ W0
            32, // 32 66 W0
            64, // 64 __ W0
            64, // 64 66 W0
            64, // 64 __ W1
            64  // 64 66 W1
        }
    };

    ZyanU8 index = (instruction->attributes & ZYDIS_ATTRIB_HAS_OPERANDSIZE) ? 1 : 0;
    if ((instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_32) ||
        (instruction->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_32))
    {
        index += 2;
    }
    else if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
    {
        index += 4;
        index += (context->vector_unified.W & 0x01) << 1;
    }

    ZYAN_ASSERT(definition->operand_size_map < ZYAN_ARRAY_LENGTH(operand_size_map));
    ZYAN_ASSERT(index < ZYAN_ARRAY_LENGTH(operand_size_map[definition->operand_size_map]));

    instruction->operand_width = operand_size_map[definition->operand_size_map][index];
    context->eosz_index = instruction->operand_width >> 5;

    // TODO: Cleanup code and remove hardcoded condition
    if (definition->operand_size_map == 1)
    {
        instruction->operand_width = 8;
    }
}